

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall ON_BezierCurve::GetCV(ON_BezierCurve *this,int i,ON_3dPoint *point)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  if (this->m_cv == (double *)0x0) {
    return false;
  }
  pdVar1 = this->m_cv + (long)i * (long)this->m_cv_stride;
  if (this->m_is_rat == 0) {
    point->x = *pdVar1;
    iVar2 = this->m_dim;
    dVar4 = 0.0;
    dVar3 = 0.0;
    if (1 < iVar2) {
      dVar3 = pdVar1[1];
    }
    point->y = dVar3;
    if (2 < iVar2) {
      dVar4 = pdVar1[2];
    }
  }
  else {
    iVar2 = this->m_dim;
    dVar3 = pdVar1[iVar2];
    dVar4 = 0.0;
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      return false;
    }
    dVar3 = 1.0 / dVar3;
    point->x = *pdVar1 * dVar3;
    if (1 < iVar2) {
      dVar4 = pdVar1[1] * dVar3;
    }
    point->y = dVar4;
    dVar4 = 0.0;
    if (2 < iVar2) {
      dVar4 = dVar3 * pdVar1[2];
    }
  }
  point->z = dVar4;
  return true;
}

Assistant:

double* ON_BezierCurve::CV( int i ) const
{
  return m_cv ? m_cv + (i*m_cv_stride) : 0;
}